

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkBddToMuxes(Abc_Ntk_t *pNtk,int fGlobal,int Limit)

{
  ulong uVar1;
  long lVar2;
  Abc_Ntk_t *pNtkNew;
  DdManager *pDVar3;
  st__table *psVar4;
  Abc_Obj_t *pAVar5;
  DdNode *pDVar6;
  void *pvVar7;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *p;
  ProgressBar *p_00;
  long *plVar8;
  char *pString;
  int iVar9;
  char *__s;
  long lVar10;
  
  pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  if (fGlobal == 0) {
    if ((pNtk->ntkFunc != ABC_FUNC_BDD) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
      __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                    ,0xb0,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    p = Abc_NtkDfs(pNtk,0);
    p_00 = Extra_ProgressBarStart(_stdout,p->nSize);
    for (iVar9 = 0; iVar9 < p->nSize; iVar9 = iVar9 + 1) {
      plVar8 = (long *)Vec_PtrEntry(p,iVar9);
      Extra_ProgressBarUpdate(p_00,iVar9,pString);
      if ((*(uint *)((long)plVar8 + 0x14) & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                      ,0xb8,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      uVar1 = plVar8[7];
      pDVar3 = *(DdManager **)(*plVar8 + 0x100);
      psVar4 = st__init_table(st__ptrcmp,st__ptrhash);
      for (lVar10 = 0; lVar10 < *(int *)((long)plVar8 + 0x1c); lVar10 = lVar10 + 1) {
        lVar2 = *(long *)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                         (long)*(int *)(plVar8[4] + lVar10 * 4) * 8);
        pDVar6 = Cudd_bddIthVar(pDVar3,(int)lVar10);
        st__insert(psVar4,(char *)pDVar6,*(char **)(lVar2 + 0x40));
      }
      pAVar5 = Abc_NodeBddToMuxes_rec(pDVar3,(DdNode *)(uVar1 & 0xfffffffffffffffe),pNtkNew,psVar4);
      st__free_table(psVar4);
      if ((uVar1 & 1) != 0) {
        pAVar5 = Abc_NtkCreateNodeInv(pNtkNew,pAVar5);
      }
      if (plVar8[8] != 0) {
        __assert_fail("pNode->pCopy == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                      ,0xbb,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      plVar8[8] = (long)pAVar5;
    }
    Vec_PtrFree(p);
    Extra_ProgressBarStop(p_00);
    Abc_NtkFinalize(pNtk,pNtkNew);
  }
  else {
    if (pNtk->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                    ,0x111,"int Abc_NtkBddToMuxesPerformGlo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
    }
    iVar9 = 0;
    pDVar3 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,Limit,1,1,0,0);
    if (pDVar3 == (DdManager *)0x0) {
      __s = "Construction of global BDDs has failed.";
      goto LAB_002a084b;
    }
    psVar4 = st__init_table(st__ptrcmp,st__ptrhash);
    for (; iVar9 < pNtkNew->vCis->nSize; iVar9 = iVar9 + 1) {
      pAVar5 = Abc_NtkCi(pNtkNew,iVar9);
      pDVar6 = Cudd_bddIthVar(pDVar3,iVar9);
      st__insert(psVar4,(char *)pDVar6,(char *)pAVar5);
    }
    for (iVar9 = 0; iVar9 < pNtk->vCos->nSize; iVar9 = iVar9 + 1) {
      pAVar5 = Abc_NtkCo(pNtk,iVar9);
      pvVar7 = Abc_ObjGlobalBdd(pAVar5);
      pFanin = Abc_NodeBddToMuxes_rec
                         (pDVar3,(DdNode *)((ulong)pvVar7 & 0xfffffffffffffffe),pNtkNew,psVar4);
      if (((ulong)pvVar7 & 1) != 0) {
        pFanin = Abc_NtkCreateNodeInv(pNtkNew,pFanin);
      }
      Abc_ObjAddFanin((pAVar5->field_6).pCopy,pFanin);
    }
    st__free_table(psVar4);
    Abc_NtkFreeGlobalBdds(pNtk,0);
    Extra_StopManager(pDVar3);
    Abc_NtkCleanCopy(pNtk);
  }
  iVar9 = Abc_NtkCheck(pNtkNew);
  if (iVar9 != 0) {
    return pNtkNew;
  }
  __s = "Abc_NtkBddToMuxes: The network check has failed.";
LAB_002a084b:
  puts(__s);
  Abc_NtkDelete(pNtkNew);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkBddToMuxes( Abc_Ntk_t * pNtk, int fGlobal, int Limit )
{
    Abc_Ntk_t * pNtkNew;
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    if ( fGlobal ) 
    {
        if ( !Abc_NtkBddToMuxesPerformGlo( pNtk, pNtkNew, Limit ) )
        {
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
    }
    else
    {
        Abc_NtkBddToMuxesPerform( pNtk, pNtkNew );
        Abc_NtkFinalize( pNtk, pNtkNew );
    }
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkBddToMuxes: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}